

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_cardinality(run_container_t *run)

{
  uint uVar1;
  run_container_t *in_RDI;
  run_container_t *in_stack_00000118;
  run_container_t *in_stack_00000258;
  undefined4 local_4;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    uVar1 = croaring_hardware_support();
    if ((uVar1 & 1) == 0) {
      local_4 = _scalar_run_container_cardinality(in_RDI);
    }
    else {
      local_4 = _avx2_run_container_cardinality(in_stack_00000118);
    }
  }
  else {
    local_4 = _avx512_run_container_cardinality(in_stack_00000258);
  }
  return local_4;
}

Assistant:

int run_container_cardinality(const run_container_t *run) {
#if CROARING_COMPILER_SUPPORTS_AVX512
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX512) {
        return _avx512_run_container_cardinality(run);
    } else
#endif
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        return _avx2_run_container_cardinality(run);
    } else {
        return _scalar_run_container_cardinality(run);
    }
}